

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::RecurrentParameter::MergeFrom(RecurrentParameter *this,RecurrentParameter *from)

{
  uint uVar1;
  void *pvVar2;
  LogMessage *other;
  FillerParameter *pFVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x881f);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if (this->weight_filler_ == (FillerParameter *)0x0) {
        pFVar3 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar3);
        this->weight_filler_ = pFVar3;
      }
      pFVar3 = from->weight_filler_;
      if (pFVar3 == (FillerParameter *)0x0) {
        pFVar3 = (FillerParameter *)&_FillerParameter_default_instance_;
      }
      FillerParameter::MergeFrom(this->weight_filler_,pFVar3);
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->bias_filler_ == (FillerParameter *)0x0) {
        pFVar3 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar3);
        this->bias_filler_ = pFVar3;
      }
      pFVar3 = from->bias_filler_;
      if (pFVar3 == (FillerParameter *)0x0) {
        pFVar3 = (FillerParameter *)&_FillerParameter_default_instance_;
      }
      FillerParameter::MergeFrom(this->bias_filler_,pFVar3);
    }
    if ((uVar1 & 4) != 0) {
      this->num_output_ = from->num_output_;
    }
    if ((uVar1 & 8) != 0) {
      this->debug_info_ = from->debug_info_;
    }
    if ((uVar1 & 0x10) != 0) {
      this->expose_hidden_ = from->expose_hidden_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void RecurrentParameter::MergeFrom(const RecurrentParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.RecurrentParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 31u) {
    if (cached_has_bits & 0x00000001u) {
      mutable_weight_filler()->::caffe::FillerParameter::MergeFrom(from.weight_filler());
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_bias_filler()->::caffe::FillerParameter::MergeFrom(from.bias_filler());
    }
    if (cached_has_bits & 0x00000004u) {
      num_output_ = from.num_output_;
    }
    if (cached_has_bits & 0x00000008u) {
      debug_info_ = from.debug_info_;
    }
    if (cached_has_bits & 0x00000010u) {
      expose_hidden_ = from.expose_hidden_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}